

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_mvzs(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg;
  ea_what what;
  TCGv_i32 reg;
  TCGv_i32 src;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  src._4_4_ = (uint)((insn & 0x40) != 0);
  what = EA_LOADU;
  if ((insn & 0x80) == 0) {
    what = EA_LOADS;
  }
  arg = gen_ea(env,s,insn,src._4_4_,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,what,
               (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],arg);
    gen_logic_cc(s,arg,src._4_4_);
  }
  return;
}

Assistant:

DISAS_INSN(mvzs)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv src;
    TCGv reg;

    if (insn & 0x40)
        opsize = OS_WORD;
    else
        opsize = OS_BYTE;
    SRC_EA(env, src, opsize, (insn & 0x80) == 0, NULL);
    reg = DREG(insn, 9);
    tcg_gen_mov_i32(tcg_ctx, reg, src);
    gen_logic_cc(s, src, opsize);
}